

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

int ShowDemoWindowWidgets::Funcs::MyResizeCallback(ImGuiInputTextCallbackData *data)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  void *__dest;
  int iVar4;
  
  if (data->EventFlag == 0x40000) {
    piVar3 = (int *)data->UserData;
    if (*(char **)(piVar3 + 2) != data->Buf) {
      __assert_fail("my_str->begin() == data->Buf",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_demo.cpp"
                    ,0x5b2,
                    "static int ShowDemoWindowWidgets()::Funcs::MyResizeCallback(ImGuiInputTextCallbackData *)"
                   );
    }
    iVar1 = data->BufSize;
    iVar2 = piVar3[1];
    if (iVar2 < iVar1) {
      if (iVar2 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar2 / 2 + iVar2;
      }
      if (iVar4 <= iVar1) {
        iVar4 = iVar1;
      }
      if (iVar2 < iVar4) {
        __dest = ImGui::MemAlloc((long)iVar4);
        if (*(void **)(piVar3 + 2) != (void *)0x0) {
          memcpy(__dest,*(void **)(piVar3 + 2),(long)*piVar3);
          ImGui::MemFree(*(void **)(piVar3 + 2));
        }
        *(void **)(piVar3 + 2) = __dest;
        piVar3[1] = iVar4;
      }
    }
    *piVar3 = iVar1;
    data->Buf = *(char **)(piVar3 + 2);
  }
  return 0;
}

Assistant:

static int MyResizeCallback(ImGuiInputTextCallbackData* data)
                {
                    if (data->EventFlag == ImGuiInputTextFlags_CallbackResize)
                    {
                        ImVector<char>* my_str = (ImVector<char>*)data->UserData;
                        IM_ASSERT(my_str->begin() == data->Buf);
                        my_str->resize(data->BufSize); // NB: On resizing calls, generally data->BufSize == data->BufTextLen + 1
                        data->Buf = my_str->begin();
                    }
                    return 0;
                }